

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall embree::TutorialApplication::displayFunc(TutorialApplication *this)

{
  ostream *poVar1;
  int64_t iVar2;
  long *in_RDI;
  float fVar3;
  double dVar4;
  ImGuiWindowFlags in_stack_00000094;
  bool *in_stack_00000098;
  ostringstream stream;
  double dt1;
  double total_fps;
  double total_dt;
  double render_fps;
  double render_dt;
  ImGuiWindowFlags window_flags;
  double mrayps;
  double dt0;
  ISPCCamera ispccamera;
  float time;
  double t0;
  TutorialApplication *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  TutorialApplication *in_stack_fffffffffffffcb0;
  double in_stack_fffffffffffffcb8;
  Averaged<double> *in_stack_fffffffffffffcc0;
  Averaged<double> *in_stack_fffffffffffffcc8;
  char *local_320;
  char *local_318;
  Camera *in_stack_fffffffffffffd18;
  ImDrawData *in_stack_fffffffffffffd30;
  long local_2c8 [5];
  size_t in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  Camera *in_stack_fffffffffffffe18;
  double local_118;
  string local_100 [8];
  Camera *in_stack_ffffffffffffff08;
  undefined1 local_dc [48];
  float local_ac;
  PerspectiveCameraData local_a8;
  Camera local_68;
  float local_24;
  double local_20;
  long *local_10;
  long *local_8;
  
  local_20 = getSeconds();
  if ((g_motion_blur & 1U) == 0) {
    if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
      dVar4 = (double)*(float *)((long)in_RDI + 0x1c4);
    }
    else {
      fVar3 = sinf(ABS((float)(local_20 - (double)in_RDI[0x31])));
      dVar4 = (double)fVar3 * 0.5 + 0.5;
    }
  }
  else {
    dVar4 = (double)(float)(local_20 - (double)in_RDI[0x31]);
  }
  local_24 = (float)dVar4;
  Camera::move(in_stack_fffffffffffffd18,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
               (float)((ulong)dVar4 >> 0x20));
  local_10 = in_RDI + 0x1a;
  if (*local_10 != 0) {
    local_8 = in_RDI + 0x1a;
    (**(code **)(*(long *)*local_8 + 0x80))(&local_a8);
    Camera::Camera(&local_68,&local_a8,*(Handedness *)((long)in_RDI + 0x114));
    Camera::operator=((Camera *)(in_RDI + 0x1c),&local_68);
  }
  Camera::getISPCCamera
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if ((*(byte *)(in_RDI + 0x5e) & 1) != 0) {
    Camera::str_abi_cxx11_(in_stack_ffffffffffffff08);
    poVar1 = std::operator<<((ostream *)&std::cout,local_100);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_100);
  }
  initRayStats(in_stack_fffffffffffffca0);
  (**(code **)(*in_RDI + 0x58))
            (in_RDI,in_RDI[0x25],(int)in_RDI[0x24],*(undefined4 *)((long)in_RDI + 0x124),local_dc);
  local_118 = getSeconds();
  local_118 = local_118 - local_20;
  if ((local_ac != 0.0) || (NAN(local_ac))) {
    local_118 = (double)local_ac;
  }
  Averaged<double>::add(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  iVar2 = getNumRays(in_stack_fffffffffffffcb0);
  Averaged<double>::add(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  glRasterPos2i(0xffffffff,1);
  glPixelZoom();
  glDrawPixels((int)in_RDI[0x24],*(undefined4 *)((long)in_RDI + 0x124),0x1908,0x1401,in_RDI[0x25]);
  ImGui_ImplOpenGL2_NewFrame();
  ImGui_ImplGlfw_NewFrame();
  ImGui::NewFrame();
  ImGui::SetNextWindowBgAlpha(0.3);
  ImGui::Begin(_stream,in_stack_00000098,in_stack_00000094);
  (**(code **)(*in_RDI + 0x50))();
  dVar4 = Averaged<double>::get(in_stack_fffffffffffffcc8);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_318 = (char *)(1.0 / dVar4);
  }
  else {
    local_318 = (char *)0x0;
  }
  ImGui::Text(local_318,"Render: %3.2f fps");
  dVar4 = Averaged<double>::get(in_stack_fffffffffffffcc8);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_320 = (char *)(1.0 / dVar4);
  }
  else {
    local_320 = (char *)0x0;
  }
  ImGui::Text(local_320,"Total: %3.2f fps");
  Averaged<double>::get(in_stack_fffffffffffffcc8);
  ImGui::Text("%3.2f Mray/s");
  ImGui::End();
  ImGui::Render();
  ImGui::GetDrawData();
  ImGui_ImplOpenGL2_RenderDrawData(in_stack_fffffffffffffd30);
  glfwSwapBuffers((GLFWwindow *)in_stack_fffffffffffffca0);
  dVar4 = getSeconds();
  dVar4 = dVar4 - local_20;
  Averaged<double>::add(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  if ((*(byte *)((long)in_RDI + 0x1c9) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
    std::ios_base::setf((ios_base *)in_stack_fffffffffffffcb0,
                        (fmtflags)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                        (fmtflags)in_stack_fffffffffffffca8);
    std::ios_base::precision((ios_base *)((long)local_2c8 + *(long *)(local_2c8[0] + -0x18)),2);
    std::operator<<((ostream *)local_2c8,"render: ");
    poVar1 = (ostream *)std::ostream::operator<<(local_2c8,1.0 / local_118);
    std::operator<<(poVar1," fps, ");
    poVar1 = (ostream *)std::ostream::operator<<(local_2c8,local_118 * 1000.0);
    std::operator<<(poVar1," ms, ");
    poVar1 = (ostream *)std::ostream::operator<<(local_2c8,(double)iVar2 / (local_118 * 1000000.0));
    std::operator<<(poVar1," Mray/s, ");
    std::operator<<((ostream *)local_2c8,"total: ");
    poVar1 = (ostream *)std::ostream::operator<<(local_2c8,1.0 / dVar4);
    std::operator<<(poVar1," fps, ");
    poVar1 = (ostream *)std::ostream::operator<<(local_2c8,dVar4 * 1000.0);
    std::operator<<(poVar1," ms, ");
    poVar1 = (ostream *)std::ostream::operator<<(local_2c8,*(uint *)(in_RDI + 0x24));
    poVar1 = std::operator<<(poVar1,"x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)((long)in_RDI + 0x124));
    std::operator<<(poVar1," pixels");
    std::__cxx11::ostringstream::str();
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffd18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd18);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  }
  return;
}

Assistant:

void TutorialApplication::displayFunc()
  {
    double t0 = getSeconds();
    const float time = g_motion_blur ? float(t0-time0) : (animate ? 0.5 * sinf(fabsf(float(t0-time0))) + 0.5 : render_time);
    
    /* update camera */
    camera.move(moveDelta.x*speed, moveDelta.y*speed, moveDelta.z*speed);

    /* update animated camera */
    if (animated_camera)
      camera = Camera(animated_camera->get(time),camera.handedness);
    
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
     if (print_camera)
      std::cout << camera.str() << std::endl;

    /* render image using ISPC */
    initRayStats();
    render(pixels,width,height,time,ispccamera);
    double dt0 = getSeconds()-t0;
    if (ispccamera.render_time != 0.0) dt0 = ispccamera.render_time;
    avg_render_time.add(dt0);
    double mrayps = double(getNumRays())/(1000000.0*dt0);
    avg_mrayps.add(mrayps);

    /* draw pixels to screen */
    glRasterPos2i(-1,1);
    glPixelZoom(1.0f,-1.0f);
    glDrawPixels(width,height,GL_RGBA,GL_UNSIGNED_BYTE,pixels);

    // Start the Dear ImGui frame
    ImGui_ImplOpenGL2_NewFrame();
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    
    ImGuiWindowFlags window_flags = 0;
    window_flags |= ImGuiWindowFlags_NoTitleBar;
    //window_flags |= ImGuiWindowFlags_NoScrollbar;
    //window_flags |= ImGuiWindowFlags_MenuBar;
    //window_flags |= ImGuiWindowFlags_NoMove;
    //window_flags |= ImGuiWindowFlags_NoResize;
    //window_flags |= ImGuiWindowFlags_NoCollapse;
    //window_flags |= ImGuiWindowFlags_NoNav;

    //ImGui::GetStyle().WindowBorderSize = 0.0f;
    //ImGui::SetNextWindowPos(ImVec2(width-200,0));
    //ImGui::SetNextWindowSize(ImVec2(200,height));
    ImGui::SetNextWindowBgAlpha(0.3f);
    ImGui::Begin("Embree", nullptr, window_flags);
    drawGUI();
    
    double render_dt = avg_render_time.get();
    double render_fps = render_dt != 0.0 ? 1.0f/render_dt : 0.0;
    ImGui::Text("Render: %3.2f fps",render_fps);

    double total_dt = avg_frame_time.get();
    double total_fps = total_dt != 0.0 ? 1.0f/total_dt : 0.0;
    ImGui::Text("Total: %3.2f fps",total_fps);

#if defined(RAY_STATS) && !defined(EMBREE_SYCL_TUTORIAL)
    ImGui::Text("%3.2f Mray/s",avg_mrayps.get());
#endif
    ImGui::End();
     
    //ImGui::ShowDemoWindow();
        
    ImGui::Render();
    ImGui_ImplOpenGL2_RenderDrawData(ImGui::GetDrawData());
    
    glfwSwapBuffers(window);

#ifdef __APPLE__
    // work around glfw issue #1334
    // https://github.com/glfw/glfw/issues/1334
    static bool macMoved = false;

    if (!macMoved) {
      int x, y;
      glfwGetWindowPos(window, &x, &y);
      glfwSetWindowPos(window, ++x, y);
      macMoved = true;
    }
#endif

    double dt1 = getSeconds()-t0;
    avg_frame_time.add(dt1);

    if (print_frame_rate)
    {
      std::ostringstream stream;
      stream.setf(std::ios::fixed, std::ios::floatfield);
      stream.precision(2);
      stream << "render: ";
      stream << 1.0f/dt0 << " fps, ";
      stream << dt0*1000.0f << " ms, ";
#if defined(RAY_STATS) && !defined(EMBREE_SYCL_TUTORIAL)
      stream << mrayps << " Mray/s, ";
#endif
      stream << "total: ";
      stream << 1.0f/dt1 << " fps, ";
      stream << dt1*1000.0f << " ms, ";
      stream << width << "x" << height << " pixels";
      std::cout << stream.str() << std::endl;
    } 
  }